

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::InvalidInputException<short,short>
          (InvalidInputException *this,string *msg,short params,short params_1)

{
  undefined8 in_RSI;
  string *in_RDI;
  string local_38 [44];
  
  Exception::ConstructMessage<short,short>
            (in_RDI,(short)((ulong)in_RSI >> 0x30),(short)((ulong)in_RSI >> 0x20));
  duckdb::InvalidInputException::InvalidInputException((InvalidInputException *)in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}